

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O3

void MULTICLASS::parse_label(parser *param_1,shared_data *sd,void *v,v_array<substring> *words)

{
  substring *s;
  int iVar1;
  long lVar2;
  uint64_t uVar3;
  ostream *poVar4;
  vw_exception *this;
  char *pcVar5;
  bool bVar6;
  float fVar7;
  stringstream __msg;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0;
  
  s = words->_begin;
  lVar2 = (long)words->_end - (long)s >> 4;
  if (lVar2 != 0) {
    if (lVar2 == 2) {
      if (sd->ldict == (namedlabels *)0x0) {
        iVar1 = int_of_substring(*s);
      }
      else {
        uVar3 = namedlabels::get(sd->ldict,s);
        iVar1 = (int)uVar3;
      }
      *(int *)v = iVar1;
      fVar7 = float_of_substring(words->_begin[1]);
      *(float *)((long)v + 4) = fVar7;
    }
    else {
      if (lVar2 == 1) {
        if (sd->ldict == (namedlabels *)0x0) {
          iVar1 = int_of_substring(*s);
        }
        else {
          uVar3 = namedlabels::get(sd->ldict,s);
          iVar1 = (int)uVar3;
        }
        *(int *)v = iVar1;
        *(undefined4 *)((long)v + 4) = 0x3f800000;
        goto LAB_00263a47;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"malformed example!\n",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"words.size() = ",0xf);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  iVar1 = *v;
LAB_00263a47:
  if (iVar1 != 0) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_1a0,"label 0 is not allowed for multiclass.  Valid labels are {1,k}",0x3e);
  bVar6 = sd->ldict == (namedlabels *)0x0;
  pcVar5 = "\nthis likely happened because you specified an invalid label with named labels";
  if (bVar6) {
    pcVar5 = "";
  }
  lVar2 = 0x4e;
  if (bVar6) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,pcVar5,lVar2);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/multiclass.cc"
             ,0x60,&local_1d0);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void parse_label(parser*, shared_data* sd, void* v, v_array<substring>& words)
{
  label_t* ld = (label_t*)v;

  switch (words.size())
  {
    case 0:
      break;
    case 1:
      ld->label = sd->ldict ? (uint32_t)sd->ldict->get(words[0]) : int_of_substring(words[0]);
      ld->weight = 1.0;
      break;
    case 2:
      ld->label = sd->ldict ? (uint32_t)sd->ldict->get(words[0]) : int_of_substring(words[0]);
      ld->weight = float_of_substring(words[1]);
      break;
    default:
      cerr << "malformed example!\n";
      cerr << "words.size() = " << words.size() << endl;
  }
  if (ld->label == 0)
    THROW("label 0 is not allowed for multiclass.  Valid labels are {1,k}"
        << (sd->ldict ? "\nthis likely happened because you specified an invalid label with named labels" : ""));
}